

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>::
BindResources(ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
              *this,IResourceMapping *pResourceMapping,BIND_SHADER_RESOURCES_FLAGS Flags)

{
  long lVar1;
  Uint32 v;
  ulong uVar2;
  BIND_SHADER_RESOURCES_FLAGS Flags_00;
  string msg;
  string local_50;
  
  if (pResourceMapping == (IResourceMapping *)0x0) {
    FormatString<char[51]>
              (&local_50,(char (*) [51])"Failed to bind resources: resource mapping is null");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"BindResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x362);
    std::__cxx11::string::~string((string *)&local_50);
  }
  Flags_00 = Flags | BIND_SHADER_RESOURCES_UPDATE_ALL;
  if ((Flags & BIND_SHADER_RESOURCES_UPDATE_ALL) != 0) {
    Flags_00 = Flags;
  }
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < *(uint *)&this[1].m_Owner; uVar2 = uVar2 + 1) {
    ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
    ::BindResources((ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
                     *)((long)&(this->m_pVariables->
                               super_ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
                               ).super_IShaderResourceVariable.super_IObject._vptr_IObject + lVar1),
                    pResourceMapping,Flags_00);
    lVar1 = lVar1 + 0x18;
  }
  return;
}

Assistant:

void BindResources(IResourceMapping* pResourceMapping, BIND_SHADER_RESOURCES_FLAGS Flags)
    {
        DEV_CHECK_ERR(pResourceMapping != nullptr, "Failed to bind resources: resource mapping is null");

        if ((Flags & BIND_SHADER_RESOURCES_UPDATE_ALL) == 0)
            Flags |= BIND_SHADER_RESOURCES_UPDATE_ALL;

        for (Uint32 v = 0; v < static_cast<ThisImplType*>(this)->m_NumVariables; ++v)
        {
            m_pVariables[v].BindResources(pResourceMapping, Flags);
        }
    }